

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  undefined8 in_path;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  string *psVar4;
  string local_2b8;
  cmAlphaNum local_298;
  cmAlphaNum local_268;
  string local_238;
  cmAlphaNum local_218;
  cmAlphaNum local_1e8;
  string local_1b8;
  cmSourceFile *local_198;
  cmSourceFile *sf;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  string depLocation;
  string local_f0;
  undefined1 local_d0 [8];
  string tLocation;
  cmGeneratorTarget *target;
  string local_78;
  uint local_54;
  undefined1 local_50 [8];
  string name;
  string *dep_local;
  string *config_local;
  string *inName_local;
  cmLocalGenerator *this_local;
  
  name.field_2._8_8_ = dep;
  cmsys::SystemTools::GetFilenameName((string *)local_50,inName);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    this_local._7_1_ = 0;
    local_54 = 1;
    goto LAB_001b3cdd;
  }
  cmsys::SystemTools::GetFilenameLastExtension(&local_78,(string *)local_50);
  bVar1 = std::operator==(&local_78,".exe");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&target,(string *)local_50);
    std::__cxx11::string::operator=((string *)local_50,(string *)&target);
    std::__cxx11::string::~string((string *)&target);
  }
  tLocation.field_2._8_8_ = FindGeneratorTargetToUse(this,(string *)local_50);
  if ((cmGeneratorTarget *)tLocation.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
LAB_001b3ab3:
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)inName);
      this_local._7_1_ = 1;
      local_54 = 1;
    }
    else {
      local_198 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
      if (local_198 == (cmSourceFile *)0x0) {
        psVar4 = GetCurrentSourceDirectory_abi_cxx11_(this);
        cmAlphaNum::cmAlphaNum(&local_1e8,psVar4);
        cmAlphaNum::cmAlphaNum(&local_218,'/');
        cmStrCat<std::__cxx11::string>(&local_1b8,&local_1e8,&local_218,inName);
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        bVar1 = cmsys::SystemTools::FileExists((string *)name.field_2._8_8_);
        if (!bVar1) {
          psVar4 = GetCurrentBinaryDirectory_abi_cxx11_(this);
          cmAlphaNum::cmAlphaNum(&local_268,psVar4);
          cmAlphaNum::cmAlphaNum(&local_298,'/');
          cmStrCat<std::__cxx11::string>(&local_238,&local_268,&local_298,inName);
          std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)&local_238);
          std::__cxx11::string::~string((string *)&local_238);
        }
        in_path = name.field_2._8_8_;
        psVar4 = GetBinaryDirectory_abi_cxx11_(this);
        cmsys::SystemTools::CollapseFullPath(&local_2b8,(string *)in_path,psVar4);
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        this_local._7_1_ = 1;
        local_54 = 1;
      }
      else {
        psVar4 = cmSourceFile::ResolveFullPath(local_198,(string *)0x0,(string *)0x0);
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)psVar4);
        this_local._7_1_ = 1;
        local_54 = 1;
      }
    }
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_d0);
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_);
      if ((-1 < (int)TVar2) &&
         (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_),
         (int)TVar2 < 4)) {
        psVar4 = cmGeneratorTarget::GetLocation((cmGeneratorTarget *)tLocation.field_2._8_8_,config)
        ;
        std::__cxx11::string::operator=((string *)local_d0,(string *)psVar4);
        cmsys::SystemTools::GetFilenamePath(&local_f0,(string *)local_d0);
        std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        cmsys::SystemTools::CollapseFullPath
                  ((string *)((long)&depLocation.field_2 + 8),(string *)local_d0);
        std::__cxx11::string::operator=
                  ((string *)local_d0,(string *)(depLocation.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(depLocation.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)&local_150,(string *)inName);
      cmsys::SystemTools::GetFilenamePath((string *)local_130,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      cmsys::SystemTools::CollapseFullPath(&local_170,(string *)local_130);
      std::__cxx11::string::operator=((string *)local_130,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_130,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)inName);
        this_local._7_1_ = 1;
      }
      local_54 = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_d0);
      if (local_54 != 0) goto LAB_001b3cdd;
    }
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_);
    if (MODULE_LIBRARY < TVar2) {
      if (TVar2 - OBJECT_LIBRARY < 4) {
        this_local._7_1_ = 0;
        local_54 = 1;
        goto LAB_001b3cdd;
      }
      if (TVar2 != UNKNOWN_LIBRARY) goto LAB_001b3ab3;
    }
    cmGeneratorTarget::GetFullPath
              ((string *)&sf,(cmGeneratorTarget *)tLocation.field_2._8_8_,config,
               RuntimeBinaryArtifact,true);
    std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)&sf);
    std::__cxx11::string::~string((string *)&sf);
    this_local._7_1_ = 1;
    local_54 = 1;
  }
LAB_001b3cdd:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }
  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact,
                                  /*realname=*/true);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->ResolveFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = cmStrCat(this->GetCurrentSourceDirectory(), '/', inName);

  // If the in-source path does not exist, assume it instead lives in the
  // binary directory.
  if (!cmSystemTools::FileExists(dep)) {
    dep = cmStrCat(this->GetCurrentBinaryDirectory(), '/', inName);
  }

  dep = cmSystemTools::CollapseFullPath(dep, this->GetBinaryDirectory());

  return true;
}